

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  ushort uVar6;
  undefined8 uVar7;
  BYTE *e;
  ushort *puVar8;
  ushort *puVar9;
  char cVar10;
  int iVar11;
  byte *pbVar12;
  ushort *puVar13;
  ulong uVar14;
  ulong uVar15;
  ushort *puVar16;
  char *pcVar17;
  char *pcVar18;
  BYTE *s_2;
  byte *pbVar19;
  char *pcVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  uint uVar26;
  BYTE *d_3;
  ulong uVar27;
  char *pcVar28;
  ulong uStack_70;
  int local_68;
  
  puVar8 = (ushort *)0xffffffffffffffff;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar8 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      uVar14 = (ulong)(uint)maxOutputSize;
      if (0x3f < (uint)maxOutputSize) {
        puVar9 = (ushort *)(pbVar2 + -0xf);
        uVar23 = 0;
        puVar16 = (ushort *)source;
LAB_0010c240:
        do {
          puVar8 = (ushort *)(dest + uVar23);
          puVar1 = (ushort *)((long)puVar16 + 1);
          bVar5 = (byte)*puVar16;
          uVar26 = (uint)bVar5;
          uStack_70 = (ulong)(uint)(bVar5 >> 4);
          puVar13 = puVar1;
          if (bVar5 >> 4 == 0xf) {
            if ((puVar1 < puVar9) && (puVar13 = puVar16 + 1, puVar13 <= puVar9)) {
              uStack_70 = (ulong)*(byte *)puVar1;
              if (uStack_70 == 0xff) {
                uStack_70 = 0xff;
                puVar16 = (ushort *)((long)puVar16 + 3);
                do {
                  puVar13 = puVar16;
                  if (puVar9 < puVar13) goto LAB_0010c465;
                  uStack_70 = uStack_70 + *(byte *)((long)puVar13 + -1);
                  puVar16 = (ushort *)((long)puVar13 + 1);
                } while ((ulong)*(byte *)((long)puVar13 + -1) == 0xff);
              }
            }
            else {
LAB_0010c465:
              uStack_70 = 0xffffffffffffffff;
            }
            if (uStack_70 == 0xffffffffffffffff) {
              iVar11 = 5;
              uStack_70 = 0xf;
            }
            else {
              uStack_70 = uStack_70 + 0xf;
              if ((CARRY8((ulong)puVar8,uStack_70)) || (CARRY8((ulong)puVar13,uStack_70))) {
                iVar11 = 5;
              }
              else if ((dest + (uVar14 - 0x20) < dest + uStack_70 + uVar23) ||
                      (pbVar2 + -0x20 < (ushort *)((long)puVar13 + uStack_70))) {
                iVar11 = 6;
              }
              else {
                lVar24 = 0;
                do {
                  uVar7 = *(undefined8 *)((byte *)((long)puVar13 + lVar24) + 8);
                  pbVar19 = (byte *)((long)puVar8 + lVar24);
                  *(undefined8 *)pbVar19 = *(undefined8 *)((long)puVar13 + lVar24);
                  *(undefined8 *)(pbVar19 + 8) = uVar7;
                  pbVar12 = (byte *)((long)puVar13 + lVar24 + 0x10);
                  uVar7 = *(undefined8 *)(pbVar12 + 8);
                  *(undefined8 *)(pbVar19 + 0x10) = *(undefined8 *)pbVar12;
                  *(undefined8 *)(pbVar19 + 0x18) = uVar7;
                  lVar24 = lVar24 + 0x20;
                } while (pbVar19 + 0x20 < dest + uStack_70 + uVar23);
                iVar11 = 0;
                puVar13 = (ushort *)((long)puVar13 + uStack_70);
                uVar23 = uStack_70 + uVar23;
              }
            }
            uVar22 = uVar23;
            if (iVar11 != 0) {
              if (iVar11 != 5) {
                if (iVar11 == 6) goto LAB_0010c6d4;
                goto LAB_0010c830;
              }
              goto LAB_0010c82b;
            }
          }
          else {
            if (pbVar2 + -0x11 < puVar1) goto LAB_0010c6d4;
            uVar7 = *(undefined8 *)((long)puVar16 + 9);
            *(undefined8 *)puVar8 = *(undefined8 *)puVar1;
            *(undefined8 *)(puVar8 + 4) = uVar7;
            puVar13 = (ushort *)((long)puVar1 + uStack_70);
            uVar22 = uVar23 + uStack_70;
          }
          pbVar19 = (byte *)(dest + uVar22);
          uVar6 = *puVar13;
          uVar15 = (ulong)uVar6;
          uVar21 = (uint)uVar6;
          puVar16 = puVar13 + 1;
          lVar24 = uVar22 - uVar15;
          pbVar12 = (byte *)(dest + lVar24);
          uVar27 = (ulong)(bVar5 & 0xf);
          if (uVar27 == 0xf) {
            puVar8 = (ushort *)((long)puVar13 + 3);
            if (pbVar2 + -4 < puVar8) {
LAB_0010c4c7:
              uStack_70 = 0xffffffffffffffff;
            }
            else {
              uStack_70 = (ulong)(byte)*puVar16;
              if (uStack_70 == 0xff) {
                uStack_70 = 0xff;
                puVar16 = puVar13 + 2;
                do {
                  puVar8 = puVar16;
                  if (pbVar2 + -4 < puVar8) goto LAB_0010c4c7;
                  uStack_70 = uStack_70 + *(byte *)((long)puVar8 + -1);
                  puVar16 = (ushort *)((long)puVar8 + 1);
                } while ((ulong)*(byte *)((long)puVar8 + -1) == 0xff);
              }
            }
            iVar11 = 5;
            uVar27 = 0xf;
            if (uStack_70 != 0xffffffffffffffff) {
              uVar27 = uStack_70 + 0x13;
              if (CARRY8((ulong)pbVar19,uVar27)) {
                iVar11 = 5;
              }
              else {
                iVar11 = 7;
                if (pbVar19 + uVar27 < dest + (uVar14 - 0x40)) {
                  iVar11 = 0;
                }
              }
            }
            puVar13 = puVar8;
            if (iVar11 == 0) {
LAB_0010c3ec:
              if (lVar24 < -0x10000) goto LAB_0010c82b;
              uVar23 = uVar27 + uVar22;
              pbVar3 = (byte *)(dest + uVar23);
              puVar16 = puVar13;
              if (0xf < uVar6) {
                do {
                  uVar7 = *(undefined8 *)(pbVar19 + -uVar15 + 8);
                  *(undefined8 *)pbVar19 = *(undefined8 *)(pbVar19 + -uVar15);
                  *(undefined8 *)(pbVar19 + 8) = uVar7;
                  uVar7 = *(undefined8 *)(pbVar19 + -uVar15 + 0x10 + 8);
                  *(undefined8 *)(pbVar19 + 0x10) = *(undefined8 *)(pbVar19 + -uVar15 + 0x10);
                  *(undefined8 *)(pbVar19 + 0x18) = uVar7;
                  pbVar19 = pbVar19 + 0x20;
                } while (pbVar19 < pbVar3);
                goto LAB_0010c240;
              }
              if (uVar15 == 4) {
                iVar11 = *(int *)pbVar12;
              }
              else if (uVar6 == 2) {
                iVar11 = CONCAT22(*(undefined2 *)pbVar12,*(undefined2 *)pbVar12);
              }
              else {
                if (uVar6 != 1) {
                  if (uVar6 < 8) {
                    pbVar19[0] = 0;
                    pbVar19[1] = 0;
                    pbVar19[2] = 0;
                    pbVar19[3] = 0;
                    *pbVar19 = *pbVar12;
                    pbVar19[1] = pbVar12[1];
                    pbVar19[2] = pbVar12[2];
                    pbVar19[3] = pbVar12[3];
                    uVar26 = inc32table[uVar6];
                    *(undefined4 *)(pbVar19 + 4) = *(undefined4 *)(pbVar12 + uVar26);
                    pbVar12 = pbVar12 + ((ulong)uVar26 - (long)dec64table[uVar6]);
                  }
                  else {
                    *(undefined8 *)pbVar19 = *(undefined8 *)pbVar12;
                    pbVar12 = pbVar12 + 8;
                  }
                  pbVar19 = pbVar19 + 8;
                  do {
                    *(undefined8 *)pbVar19 = *(undefined8 *)pbVar12;
                    pbVar19 = pbVar19 + 8;
                    pbVar12 = pbVar12 + 8;
                  } while (pbVar19 < pbVar3);
                  goto LAB_0010c240;
                }
                iVar11 = (uint)*pbVar12 * 0x1010101;
              }
              do {
                *(int *)pbVar19 = iVar11;
                *(int *)(pbVar19 + 4) = iVar11;
                pbVar19 = pbVar19 + 8;
              } while (pbVar19 < pbVar3);
              goto LAB_0010c240;
            }
            if (iVar11 != 5) {
              uVar21 = (uint)uVar6;
              if (iVar11 == 7) goto LAB_0010c780;
              goto LAB_0010c830;
            }
            goto LAB_0010c82b;
          }
          uVar23 = uVar27 + uVar22 + 4;
          uVar27 = uVar27 + 4;
          puVar8 = puVar16;
          if (dest + (uVar14 - 0x40) <= dest + uVar23) goto LAB_0010c780;
          puVar13 = puVar16;
          if (uVar6 < 8) goto LAB_0010c3ec;
          *(undefined8 *)pbVar19 = *(undefined8 *)pbVar12;
          *(undefined8 *)(pbVar19 + 8) = *(undefined8 *)(pbVar12 + 8);
          *(undefined2 *)(pbVar19 + 0x10) = *(undefined2 *)(pbVar12 + 0x10);
        } while( true );
      }
      uVar23 = 0;
      puVar9 = (ushort *)source;
LAB_0010c7ed:
      do {
        puVar13 = (ushort *)((long)puVar9 + 1);
        bVar5 = (byte)*puVar9;
        uVar22 = uVar23;
        while( true ) {
          pbVar19 = (byte *)(dest + uVar22);
          uVar26 = (uint)bVar5;
          if (bVar5 >> 4 == 0xf) break;
          uStack_70 = (ulong)(uint)(bVar5 >> 4);
          if ((source + (long)compressedSize + -0x10 <= puVar13) ||
             (dest + (uVar14 - 0x20) < pbVar19)) goto LAB_0010c6d4;
          uVar7 = *(undefined8 *)(puVar13 + 4);
          *(undefined8 *)pbVar19 = *(undefined8 *)puVar13;
          *(undefined8 *)(pbVar19 + 8) = uVar7;
          uVar22 = uVar23 + uStack_70;
          uVar27 = (ulong)(uVar26 & 0xf);
          puVar9 = (ushort *)((long)puVar13 + uStack_70) + 1;
          uVar6 = *(ushort *)((long)puVar13 + uStack_70);
          uVar21 = (uint)uVar6;
          lVar24 = uVar22 - uVar6;
          if (((uVar26 & 0xf) == 0xf) || (uVar6 < 8)) goto LAB_0010c722;
          *(undefined8 *)(dest + uVar22) = *(undefined8 *)(dest + lVar24);
          *(undefined8 *)(dest + uVar22 + 8) = *(undefined8 *)(dest + lVar24 + 8);
          *(undefined2 *)(dest + uVar22 + 0x10) = *(undefined2 *)(dest + lVar24 + 0x10);
          uVar23 = uVar22 + uVar27 + 4;
          uVar22 = uVar27 + uVar22 + 4;
          bVar5 = *(byte *)((long)puVar13 + uStack_70 + 2);
          puVar13 = (ushort *)((long)puVar13 + uStack_70 + 3);
        }
        puVar16 = (ushort *)(pbVar2 + -0xf);
        uVar22 = 0xffffffffffffffff;
        puVar8 = puVar13;
        uVar27 = uVar22;
        if (((puVar13 < puVar16) && (puVar8 = puVar9 + 1, puVar8 <= puVar16)) &&
           (uVar27 = (ulong)(byte)*puVar13, (ulong)(byte)*puVar13 == 0xff)) {
          uVar15 = 0xff;
          puVar9 = (ushort *)((long)puVar9 + 3);
          do {
            puVar8 = puVar9;
            uVar27 = uVar22;
            if (puVar16 < puVar8) break;
            uVar15 = uVar15 + *(byte *)((long)puVar8 + -1);
            uVar27 = uVar15;
            puVar9 = (ushort *)((long)puVar8 + 1);
          } while ((ulong)*(byte *)((long)puVar8 + -1) == 0xff);
        }
        uStack_70 = 0xf;
        cVar10 = '\x05';
        if ((uVar27 != 0xffffffffffffffff) &&
           (uStack_70 = uVar27 + 0xf, !CARRY8((ulong)pbVar19,uStack_70))) {
          cVar10 = CARRY8((ulong)puVar8,uStack_70) * '\x05';
        }
        puVar13 = puVar8;
        if (cVar10 != '\0') {
          if (cVar10 == '\x05') goto LAB_0010c82b;
          goto LAB_0010c830;
        }
LAB_0010c6d4:
        pcVar17 = dest + uVar23;
        uVar22 = uVar23 + uStack_70;
        if ((dest + (uVar14 - 0xc) < dest + uVar22) ||
           (puVar8 = (ushort *)((long)puVar13 + uStack_70), pbVar2 + -8 < puVar8)) {
          if (((byte *)((long)puVar13 + uStack_70) != pbVar2) || ((long)uVar14 < (long)uVar22))
          goto LAB_0010c82b;
          memmove(pcVar17,puVar13,uStack_70);
          puVar8 = (ushort *)(uVar22 & 0xffffffff);
          goto LAB_0010c830;
        }
        do {
          *(undefined8 *)pcVar17 = *(undefined8 *)puVar13;
          pcVar17 = pcVar17 + 8;
          puVar13 = puVar13 + 4;
        } while (pcVar17 < dest + uVar22);
        uVar21 = (uint)*puVar8;
        puVar9 = puVar8 + 1;
        lVar24 = uVar22 - *puVar8;
        uVar27 = (ulong)(uVar26 & 0xf);
LAB_0010c722:
        if ((int)uVar27 == 0xf) {
          puVar13 = (ushort *)((long)puVar9 + 1);
          uVar23 = 0xffffffffffffffff;
          if ((puVar13 <= pbVar2 + -4) &&
             (uVar23 = (ulong)(byte)*puVar9, (ulong)(byte)*puVar9 == 0xff)) {
            uVar27 = 0xff;
            puVar8 = puVar9 + 1;
            do {
              puVar13 = puVar8;
              uVar23 = 0xffffffffffffffff;
              if (pbVar2 + -4 < puVar13) break;
              uVar27 = uVar27 + *(byte *)((long)puVar13 + -1);
              uVar23 = uVar27;
              puVar8 = (ushort *)((long)puVar13 + 1);
            } while ((ulong)*(byte *)((long)puVar13 + -1) == 0xff);
          }
          uVar27 = uVar23 + 0xf;
          if ((uVar23 == 0xffffffffffffffff) ||
             (puVar9 = puVar13, CARRY8((ulong)(dest + uVar22),uVar27))) goto LAB_0010c82b;
        }
        uVar27 = uVar27 + 4;
        puVar8 = puVar9;
LAB_0010c780:
        puVar13 = puVar8;
        if (lVar24 < -0x10000) goto LAB_0010c82b;
        pcVar17 = dest + uVar22;
        pcVar25 = dest + lVar24;
        uVar23 = uVar22 + uVar27;
        pcVar4 = dest + uVar23;
        if (uVar21 < 8) {
          pcVar17[0] = '\0';
          pcVar17[1] = '\0';
          pcVar17[2] = '\0';
          pcVar17[3] = '\0';
          *pcVar17 = *pcVar25;
          pcVar17[1] = pcVar25[1];
          pcVar17[2] = pcVar25[2];
          pcVar17[3] = pcVar25[3];
          uVar22 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar21 << 2));
          *(undefined4 *)(pcVar17 + 4) = *(undefined4 *)(pcVar25 + uVar22);
          pcVar25 = pcVar25 + (uVar22 - (long)*(int *)((long)dec64table + (ulong)(uVar21 << 2)));
        }
        else {
          *(undefined8 *)pcVar17 = *(undefined8 *)pcVar25;
          pcVar25 = pcVar25 + 8;
        }
        pcVar18 = pcVar17 + 8;
        puVar9 = puVar8;
        if (pcVar4 <= dest + (uVar14 - 0xc)) {
          *(undefined8 *)pcVar18 = *(undefined8 *)pcVar25;
          if (0x10 < uVar27) {
            pcVar17 = pcVar17 + 0x10;
            do {
              pcVar25 = pcVar25 + 8;
              *(undefined8 *)pcVar17 = *(undefined8 *)pcVar25;
              pcVar17 = pcVar17 + 8;
            } while (pcVar17 < pcVar4);
          }
          goto LAB_0010c7ed;
        }
        iVar11 = 5;
        if (pcVar4 <= dest + (uVar14 - 5)) {
          pcVar17 = dest + (uVar14 - 7);
          pcVar20 = pcVar25;
          pcVar28 = pcVar18;
          if (pcVar18 < pcVar17) {
            do {
              *(undefined8 *)pcVar28 = *(undefined8 *)pcVar20;
              pcVar28 = pcVar28 + 8;
              pcVar20 = pcVar20 + 8;
            } while (pcVar28 < pcVar17);
            pcVar25 = pcVar25 + ((long)pcVar17 - (long)pcVar18);
            pcVar18 = pcVar17;
          }
          iVar11 = 0;
          for (; pcVar18 < pcVar4; pcVar18 = pcVar18 + 1) {
            cVar10 = *pcVar25;
            pcVar25 = pcVar25 + 1;
            *pcVar18 = cVar10;
          }
        }
      } while (iVar11 == 0);
      if (iVar11 == 5) {
LAB_0010c82b:
        local_68 = (int)source;
        puVar8 = (ushort *)(ulong)(~(uint)puVar13 + local_68);
      }
    }
  }
LAB_0010c830:
  return (int)puVar8;
}

Assistant:

LZ4_FORCE_O2 /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}